

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

void ctemplate::CreateOrCleanTestDir(string *dirname)

{
  DIR *pDVar1;
  char *pcVar2;
  allocator local_61;
  string local_60 [32];
  string local_40 [32];
  dirent *local_20;
  dirent *d;
  DIR *dir;
  string *dirname_local;
  
  dir = (DIR *)dirname;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  d = (dirent *)opendir(pcVar2);
  if (d == (dirent *)0x0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    mkdir(pcVar2,0x1ed);
  }
  else {
    while (local_20 = readdir((DIR *)d), local_20 != (dirent *)0x0) {
      pcVar2 = strstr(local_20->d_name,"template");
      pDVar1 = dir;
      if (pcVar2 != (char *)0x0) {
        pcVar2 = local_20->d_name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,pcVar2,&local_61);
        ctemplate::PathJoin(local_40,(string *)pDVar1);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        unlink(pcVar2);
        std::__cxx11::string::~string(local_40);
        std::__cxx11::string::~string(local_60);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
      }
    }
    closedir((DIR *)d);
  }
  return;
}

Assistant:

void CreateOrCleanTestDir(const string& dirname) {
  DIR* dir = opendir(dirname.c_str());
  if (!dir) {   // directory doesn't exist or something like that
    mkdir(dirname.c_str(), 0755);   // make the dir if we can
    return;
  }
  while (struct dirent* d = readdir(dir)) {
    if (strstr(d->d_name, "template"))
      unlink(PathJoin(dirname, d->d_name).c_str());
  }
  closedir(dir);
}